

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttpload.c
# Opt level: O0

FT_Error tt_face_load_cvt(TT_Face face,FT_Stream stream)

{
  FT_UShort FVar1;
  FT_Stream_CloseFunc p_Var2;
  FT_Short *limit;
  FT_Short *cur;
  FT_ULong table_len;
  FT_Memory memory;
  FT_Stream pFStack_18;
  FT_Error error;
  FT_Stream stream_local;
  TT_Face face_local;
  
  table_len = (FT_ULong)stream->memory;
  pFStack_18 = stream;
  stream_local = (FT_Stream)face;
  memory._4_4_ = (*face->goto_table)(face,0x63767420,stream,(FT_ULong *)&cur);
  if (memory._4_4_ == 0) {
    stream_local[0xd].read = (FT_Stream_IoFunc)((ulong)cur >> 1);
    p_Var2 = (FT_Stream_CloseFunc)
             ft_mem_realloc((FT_Memory)table_len,2,0,(FT_Long)stream_local[0xd].read,(void *)0x0,
                            (FT_Error *)((long)&memory + 4));
    stream_local[0xd].close = p_Var2;
    if ((memory._4_4_ == 0) &&
       (memory._4_4_ = FT_Stream_EnterFrame(pFStack_18,(long)stream_local[0xd].read << 1),
       memory._4_4_ == 0)) {
      limit = (FT_Short *)stream_local[0xd].close;
      p_Var2 = (FT_Stream_CloseFunc)((long)limit + (long)stream_local[0xd].read * 2);
      for (; limit < p_Var2; limit = limit + 1) {
        FVar1 = FT_Stream_GetUShort(pFStack_18);
        *limit = FVar1;
      }
      FT_Stream_ExitFrame(pFStack_18);
      if (*(char *)((long)&stream_local[0xe].descriptor + 1) != '\0') {
        memory._4_4_ = tt_face_vary_cvt((TT_Face)stream_local,pFStack_18);
      }
    }
  }
  else {
    stream_local[0xd].read = (FT_Stream_IoFunc)0x0;
    stream_local[0xd].close = (FT_Stream_CloseFunc)0x0;
    memory._4_4_ = 0;
  }
  return memory._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_cvt( TT_Face    face,
                    FT_Stream  stream )
  {
#ifdef TT_USE_BYTECODE_INTERPRETER

    FT_Error   error;
    FT_Memory  memory = stream->memory;
    FT_ULong   table_len;


    FT_TRACE2(( "CVT " ));

    error = face->goto_table( face, TTAG_cvt, stream, &table_len );
    if ( error )
    {
      FT_TRACE2(( "is missing\n" ));

      face->cvt_size = 0;
      face->cvt      = NULL;
      error          = FT_Err_Ok;

      goto Exit;
    }

    face->cvt_size = table_len / 2;

    if ( FT_NEW_ARRAY( face->cvt, face->cvt_size ) )
      goto Exit;

    if ( FT_FRAME_ENTER( face->cvt_size * 2L ) )
      goto Exit;

    {
      FT_Short*  cur   = face->cvt;
      FT_Short*  limit = cur + face->cvt_size;


      for ( ; cur < limit; cur++ )
        *cur = FT_GET_SHORT();
    }

    FT_FRAME_EXIT();
    FT_TRACE2(( "loaded\n" ));

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    if ( face->doblend )
      error = tt_face_vary_cvt( face, stream );
#endif

  Exit:
    return error;

#else /* !TT_USE_BYTECODE_INTERPRETER */

    FT_UNUSED( face   );
    FT_UNUSED( stream );

    return FT_Err_Ok;

#endif
  }